

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_polygon_mesh.cpp
# Opt level: O3

void __thiscall
geometrycentral::surface::SimplePolygonMesh::readMeshFromAsciiStlFile
          (SimplePolygonMesh *this,istream *in)

{
  vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator __position;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  unsigned_long *puVar11;
  bool bVar12;
  __type _Var13;
  istream *piVar14;
  pointer pVVar15;
  unsigned_long *puVar16;
  unsigned_long *puVar17;
  string *prefix;
  string *prefix_00;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> face;
  double z;
  anon_class_24_3_19152d57 assertToken;
  string line;
  double z_1;
  double y_1;
  anon_class_32_4_26ba02a2 nextLine;
  size_t lineNum;
  stringstream ss;
  string local_288;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  anon_class_24_3_19152d57 local_240;
  unsigned_long *local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  string local_210;
  double local_1f0;
  double local_1e8;
  anon_class_32_4_26ba02a2 local_1e0;
  size_t local_1c0;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  clear(this);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  local_210._M_string_length = 0;
  local_210.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_240.lineNum = &local_1c0;
  local_240.line = &local_210;
  local_1c0 = 1;
  local_240.ss = (stringstream *)local_1b8;
  local_1e0.in = in;
  local_1e0.line = local_240.line;
  local_1e0.ss = (stringstream *)local_1b8;
  local_1e0.lineNum = local_240.lineNum;
  readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(&local_1e0);
  paVar1 = &local_288.field_2;
  this_00 = &this->vertexCoordinates;
  while (bVar12 = readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(&local_1e0), bVar12
        ) {
    local_288._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"endsolid","");
    _Var13 = readMeshFromAsciiStlFile::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)&local_210,&local_288,prefix);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar1) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    if (_Var13) break;
    local_288._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"facet","");
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()(&local_240,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar1) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    local_288._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"normal","");
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()(&local_240,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar1) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    piVar14 = ::std::istream::_M_extract<double>((double *)local_1b8);
    piVar14 = ::std::istream::_M_extract<double>((double *)piVar14);
    ::std::istream::_M_extract<double>((double *)piVar14);
    local_218 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p;
    local_228 = local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_220 = local_248;
    readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(&local_1e0);
    local_288._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"outer","");
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()(&local_240,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar1) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    local_288._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"loop","");
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()(&local_240,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar1) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    while (bVar12 = readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(&local_1e0),
          bVar12) {
      local_288._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"endloop","");
      _Var13 = readMeshFromAsciiStlFile::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)&local_210,&local_288,prefix_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar1) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      if (_Var13) break;
      local_288._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"vertex","");
      readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()(&local_240,&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar1) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      piVar14 = ::std::istream::_M_extract<double>((double *)local_1b8);
      piVar14 = ::std::istream::_M_extract<double>((double *)piVar14);
      ::std::istream::_M_extract<double>((double *)piVar14);
      local_288._M_dataplus._M_p = (pointer)local_248;
      local_288._M_string_length = (size_type)local_1e8;
      local_288.field_2._M_allocated_capacity = (size_type)local_1f0;
      __position._M_current =
           (this->vertexCoordinates).
           super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->vertexCoordinates).
          super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<geometrycentral::Vector3,std::allocator<geometrycentral::Vector3>>::
        _M_realloc_insert<geometrycentral::Vector3_const&>
                  ((vector<geometrycentral::Vector3,std::allocator<geometrycentral::Vector3>> *)
                   this_00,__position,(Vector3 *)&local_288);
        pVVar15 = (this->vertexCoordinates).
                  super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (__position._M_current)->z = local_1f0;
        (__position._M_current)->x = (double)local_248;
        (__position._M_current)->y = local_1e8;
        pVVar15 = (this->vertexCoordinates).
                  super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 1;
        (this->vertexCoordinates).
        super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>.
        _M_impl.super__Vector_impl_data._M_finish = pVVar15;
      }
      local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(((long)pVVar15 -
                       (long)(this_00->
                             super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                     + -1);
      if (local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
        _M_realloc_insert<unsigned_long>
                  (&local_268,
                   (iterator)
                   local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_248);
      }
      else {
        *local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long)local_248;
        local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(&local_1e0);
    local_288._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"endfacet","");
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()(&local_240,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar1) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    pVVar15 = (this_00->
              super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar2 = *local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[1];
    uVar4 = local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[2];
    dVar5 = pVVar15[uVar3].y - pVVar15[uVar2].y;
    dVar6 = pVVar15[uVar3].z - pVVar15[uVar2].z;
    dVar7 = pVVar15[uVar3].x - pVVar15[uVar2].x;
    dVar8 = pVVar15[uVar4].y - pVVar15[uVar2].y;
    dVar9 = pVVar15[uVar4].z - pVVar15[uVar2].z;
    dVar10 = pVVar15[uVar4].x - pVVar15[uVar2].x;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar5;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar9;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar8 * dVar6;
    auVar19 = vfmsub231sd_fma(auVar29,auVar19,auVar26);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar10;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar6;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar9 * dVar7;
    auVar21 = vfmsub231sd_fma(auVar27,auVar21,auVar24);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_218;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_220;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar7;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar10 * dVar5;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar8;
    auVar18 = vfmsub231sd_fma(auVar20,auVar18,auVar23);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = auVar21._0_8_ * (double)local_228;
    auVar19 = vfmadd213sd_fma(auVar28,auVar19,auVar25);
    auVar19 = vfmadd213sd_fma(auVar22,auVar18,auVar19);
    if ((auVar19._0_8_ < 0.0) &&
       (puVar17 = local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish + -1,
       puVar11 = local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
       local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start < puVar17 &&
       local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start !=
       local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish)) {
      do {
        puVar16 = puVar11 + 1;
        uVar2 = *puVar11;
        *puVar11 = *puVar17;
        *puVar17 = uVar2;
        puVar17 = puVar17 + -1;
        puVar11 = puVar16;
      } while (puVar16 < puVar17);
    }
    ::std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)this,&local_268);
    if (local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
      operator_delete(local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SimplePolygonMesh::readMeshFromAsciiStlFile(std::istream& in) {
  clear();

  std::string line;
  std::stringstream ss;
  size_t lineNum = 1;

  auto assertToken = [&](const std::string& expected) {
    std::string token;
    ss >> token;
    if (token != expected) {
      std::ostringstream errorMessage;
      errorMessage << "Failed to parse ASCII stl file." << std::endl
                   << "Error on line " << lineNum << ". Expected \"" << expected << "\" but token \"" << token << "\""
                   << std::endl
                   << "Full line: \"" << line << "\"" << std::endl;
      throw std::runtime_error(errorMessage.str());
    }
  };

  auto nextLine = [&]() {
    if (!getline(in, line)) {
      return false;
    }

    ss = std::stringstream(line);
    lineNum++;
    return true;
  };

  auto startsWithToken = [](const std::string& str, const std::string& prefix) {
    std::stringstream ss(str);
    std::string token;
    ss >> token;
    return token == prefix;
  };
  // Eat the header line
  nextLine();  
  // Parse STL file
  while (nextLine() && !startsWithToken(line, "endsolid")) {
    assertToken("facet");
    assertToken("normal");

    // TODO: store this normal?
    Vector3 normal;
    ss >> normal;

    nextLine();

    assertToken("outer");
    assertToken("loop");

    std::vector<size_t> face;
    while (nextLine() && !startsWithToken(line, "endloop")) {
      assertToken("vertex");

      Vector3 position;
      ss >> position;
      vertexCoordinates.push_back(position);

      face.push_back(vertexCoordinates.size() - 1);
    }

    nextLine();
    assertToken("endfacet");

    // Orient face using normal
    Vector3 faceNormal = cross(vertexCoordinates[face[1]] - vertexCoordinates[face[0]],
                               vertexCoordinates[face[2]] - vertexCoordinates[face[0]]);
    if (dot(faceNormal, normal) < 0) {
      std::reverse(std::begin(face), std::end(face));
    }

    polygons.push_back(face);
  }
}